

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

Vector2f __thiscall sf::Text::findCharacterPos(Text *this,size_t index)

{
  Font *pFVar1;
  Glyph *pGVar2;
  Font *in_RSI;
  long in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Transformable *in_stack_00000010;
  Uint32 curChar;
  size_t i;
  Uint32 prevChar;
  float lineSpacing;
  float letterSpacing;
  float whitespaceWidth;
  bool isBold;
  Vector2f position;
  float in_stack_00000078;
  bool in_stack_0000007f;
  uint in_stack_00000080;
  Uint32 in_stack_00000084;
  Font *in_stack_00000088;
  Transform *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  Uint32 in_stack_ffffffffffffffa4;
  Font *pFVar7;
  Uint32 in_stack_ffffffffffffffd0;
  Uint32 UVar8;
  Font *local_18;
  Vector2f local_8;
  
  if (*(long *)(in_RDI + 0xd8) == 0) {
    Vector2<float>::Vector2(&local_8);
  }
  else {
    pFVar7 = in_RSI;
    pFVar1 = (Font *)String::getSize((String *)0x2d32dc);
    local_18 = in_RSI;
    if (pFVar1 < pFVar7) {
      local_18 = (Font *)String::getSize((String *)0x2d32fa);
    }
    pGVar2 = Font::getGlyph(in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007f,
                            in_stack_00000078);
    fVar3 = (pGVar2->advance / 3.0) * (*(float *)(in_RDI + 0xe4) - 1.0);
    fVar4 = fVar3 + pGVar2->advance;
    fVar5 = Font::getLineSpacing(pFVar7,in_stack_ffffffffffffffa4);
    fVar5 = fVar5 * *(float *)(in_RDI + 0xe8);
    Vector2<float>::Vector2(&local_8);
    UVar8 = 0;
    for (pFVar7 = (Font *)0x0; pFVar7 < local_18; pFVar7 = (Font *)((long)&pFVar7->m_library + 1)) {
      in_stack_ffffffffffffffa4 =
           String::operator[]((String *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (size_t)in_stack_ffffffffffffff98);
      fVar6 = Font::getKerning((Font *)CONCAT44(fVar3,fVar5),UVar8,in_stack_ffffffffffffffd0,
                               (uint)((ulong)pFVar7 >> 0x20),SUB81((ulong)pFVar7 >> 0x18,0));
      fVar6 = local_8.x + fVar6;
      UVar8 = in_stack_ffffffffffffffa4;
      if (in_stack_ffffffffffffffa4 == 9) {
        local_8.x = fVar4 * 4.0 + fVar6;
      }
      else if (in_stack_ffffffffffffffa4 == 10) {
        local_8 = (Vector2f)((ulong)(uint)(fVar5 + local_8.y) << 0x20);
      }
      else if (in_stack_ffffffffffffffa4 == 0x20) {
        local_8.x = fVar4 + fVar6;
      }
      else {
        local_8.x = fVar6;
        pGVar2 = Font::getGlyph(in_stack_00000088,in_stack_00000084,in_stack_00000080,
                                in_stack_0000007f,in_stack_00000078);
        local_8.x = pGVar2->advance + fVar3 + local_8.x;
      }
    }
    Transformable::getTransform(in_stack_00000010);
    local_8 = Transform::transformPoint(in_stack_ffffffffffffff98,(Vector2f *)0x2d3526);
  }
  return local_8;
}

Assistant:

Vector2f Text::findCharacterPos(std::size_t index) const
{
    // Make sure that we have a valid font
    if (!m_font)
        return Vector2f();

    // Adjust the index if it's out of range
    if (index > m_string.getSize())
        index = m_string.getSize();

    // Precompute the variables needed by the algorithm
    bool  isBold          = m_style & Bold;
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;

    // Compute the position
    Vector2f position;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < index; ++i)
    {
        Uint32 curChar = m_string[i];

        // Apply the kerning offset
        position.x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);
        prevChar = curChar;

        // Handle special characters
        switch (curChar)
        {
            case ' ':  position.x += whitespaceWidth;             continue;
            case '\t': position.x += whitespaceWidth * 4;         continue;
            case '\n': position.y += lineSpacing; position.x = 0; continue;
        }

        // For regular characters, add the advance offset of the glyph
        position.x += m_font->getGlyph(curChar, m_characterSize, isBold).advance + letterSpacing;
    }

    // Transform the position to global coordinates
    position = getTransform().transformPoint(position);

    return position;
}